

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::detectDominatedCol
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col,
          bool handleSingletonRows)

{
  double dVar1;
  double dVar2;
  pointer pHVar3;
  bool bVar4;
  Result RVar5;
  double dVar6;
  ulong uVar7;
  bool logging_on;
  anon_class_32_4_9aef3f16 weaklyDominatedCol;
  bool local_7a;
  bool local_79;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  anon_class_32_4_9aef3f16 local_50;
  
  dVar1 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  uVar7 = 0x8000000000000000;
  if ((this->impliedDualRowBounds).numInfSumLower.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start[col] == 0) {
    pHVar3 = (this->impliedDualRowBounds).sumLower.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pHVar3[col].hi;
    local_78 = dVar2 - dVar1;
    local_78 = (-dVar1 - (local_78 - dVar2)) + (dVar2 - (local_78 - (local_78 - dVar2))) +
               pHVar3[col].lo + local_78;
    uStack_70 = uVar7;
  }
  else {
    local_78 = -INFINITY;
    uStack_70 = 0;
  }
  if ((this->impliedDualRowBounds).numInfSumUpper.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start[col] == 0) {
    pHVar3 = (this->impliedDualRowBounds).sumUpper.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pHVar3[col].hi;
    dVar6 = dVar2 - dVar1;
    dVar6 = (-dVar1 - (dVar6 - dVar2)) + (dVar2 - (dVar6 - (dVar6 - dVar2))) + pHVar3[col].lo +
            dVar6;
  }
  else {
    dVar6 = INFINITY;
    uVar7 = 0;
  }
  dVar6 = -dVar6;
  uVar7 = uVar7 ^ 0x8000000000000000;
  local_7a = (this->analysis_).logging_on_;
  local_50.logging_on = &local_7a;
  local_50.handleSingletonRows = &local_79;
  RVar5 = kOk;
  local_79 = handleSingletonRows;
  local_50.this = this;
  local_50.postsolve_stack = postsolve_stack;
  if (((this->options->super_HighsOptionsStruct).dual_feasibility_tolerance < dVar6) &&
     (RVar5 = kDualInfeasible,
     -INFINITY <
     (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start[col])) {
    local_68 = dVar6;
    uStack_60 = uVar7;
    if (local_7a != false) {
      HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,5);
    }
    bVar4 = fixColToLowerOrUnbounded(this,postsolve_stack,col);
    if (bVar4) {
      this->presolve_status_ = kUnboundedOrInfeasible;
      dVar6 = local_68;
      uVar7 = uStack_60;
    }
    else {
      (this->analysis_).logging_on_ = local_7a;
      if (local_7a == true) {
        HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,5);
      }
      if ((local_79 != true) ||
         (RVar5 = removeRowSingletons(this,postsolve_stack), dVar6 = local_68, uVar7 = uStack_60,
         RVar5 == kOk)) {
        RVar5 = checkLimits(this,postsolve_stack);
        dVar6 = local_68;
        uVar7 = uStack_60;
      }
    }
  }
  if ((RVar5 == kOk) &&
     (RVar5 = kOk,
     (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start[col] == '\0')) {
    RVar5 = kOk;
    if (((this->options->super_HighsOptionsStruct).dual_feasibility_tolerance < local_78) &&
       (RVar5 = kDualInfeasible,
       (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[col] < INFINITY)) {
      local_68 = dVar6;
      uStack_60 = uVar7;
      if (local_7a == true) {
        HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,5);
      }
      bVar4 = fixColToUpperOrUnbounded(this,postsolve_stack,col);
      if (bVar4) {
        this->presolve_status_ = kUnboundedOrInfeasible;
        dVar6 = local_68;
      }
      else {
        (this->analysis_).logging_on_ = local_7a;
        if (local_7a == true) {
          HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,5);
        }
        if ((local_79 != true) ||
           (RVar5 = removeRowSingletons(this,postsolve_stack), dVar6 = local_68, RVar5 == kOk)) {
          RVar5 = checkLimits(this,postsolve_stack);
          dVar6 = local_68;
        }
      }
    }
    if ((((RVar5 == kOk) &&
         (RVar5 = kOk,
         (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[col] == '\0')) &&
        (RVar5 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                           (&local_50,col,dVar6,
                            (this->model->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[col],
                            (this->model->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[col],1), RVar5 == kOk)) &&
       (RVar5 = kOk,
       (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0')) {
      RVar5 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                        (&local_50,col,-local_78,
                         (this->model->col_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[col],
                         (this->model->col_lower_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[col],-1);
    }
  }
  return RVar5;
}

Assistant:

HPresolve::Result HPresolve::detectDominatedCol(
    HighsPostsolveStack& postsolve_stack, HighsInt col,
    bool handleSingletonRows) {
  assert(!colDeleted[col]);

  // get bounds on column dual
  double colDualUpper =
      -impliedDualRowBounds.getSumLower(col, -model->col_cost_[col]);
  double colDualLower =
      -impliedDualRowBounds.getSumUpper(col, -model->col_cost_[col]);

  const bool logging_on = analysis_.logging_on_;

  auto dominatedCol = [&](HighsInt col, double dualBound, double bound,
                          HighsInt direction) {
    // column is (strongly) dominated if the bounds on the column dual satisfy:
    // 1. lower bound >  dual feasibility tolerance (direction =  1) or
    // 2. upper bound < -dual feasibility tolerance (direction = -1).
    if (direction * dualBound <= options->dual_feasibility_tolerance)
      return Result::kOk;
    // cannot fix to +-infinity -> infeasible
    if (direction * bound == -kHighsInf) return Result::kDualInfeasible;
    if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
    // fix variable
    bool unbounded = false;
    if (direction > 0)
      unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
    else
      unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
    if (unbounded) {
      // Handle unboundedness
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      return Result::kDualInfeasible;
    }
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
    // handle row singletons (if requested)
    if (handleSingletonRows)
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    return checkLimits(postsolve_stack);
  };

  auto weaklyDominatedCol = [&](HighsInt col, double dualBound, double bound,
                                double otherBound, HighsInt direction) {
    // column is weakly dominated if the bounds on the column dual satisfy:
    // 1. lower bound >= -dual feasibility tolerance (direction =  1) or
    // 2. upper bound <=  dual feasibility tolerance (direction = -1).
    if (direction * dualBound < -options->dual_feasibility_tolerance)
      return Result::kOk;
    if (direction * bound != -kHighsInf) {
      if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
      // fix variable
      bool unbounded = false;
      if (direction > 0)
        unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
      else
        unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
      if (unbounded) {
        // Handle unboundedness
        presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
        return Result::kDualInfeasible;
      }
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
      // handle row singletons (if requested)
      if (handleSingletonRows)
        HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      return checkLimits(postsolve_stack);
    } else if (analysis_.allow_rule_[kPresolveRuleForcingCol]) {
      // get bound on dual (column) activity
      HighsCDouble sum = 0;
      if (direction > 0)
        sum = impliedDualRowBounds.getSumUpperOrig(col);
      else
        sum = impliedDualRowBounds.getSumLowerOrig(col);
      if (sum == 0.0) {
        // remove column and rows
        if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleForcingCol);
        postsolve_stack.forcingColumn(
            col, getColumnVector(col), model->col_cost_[col], otherBound,
            direction < 0, model->integrality_[col] == HighsVarType::kInteger);
        markColDeleted(col);
        HighsInt coliter = colhead[col];
        while (coliter != -1) {
          HighsInt row = Arow[coliter];
          double rhs = direction * Avalue[coliter] > 0.0
                           ? model->row_upper_[row]
                           : model->row_lower_[row];
          coliter = Anext[coliter];

          postsolve_stack.forcingColumnRemovedRow(col, row, rhs,
                                                  getRowVector(row));
          removeRow(row);
        }
        analysis_.logging_on_ = logging_on;
        if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleForcingCol);
        return checkLimits(postsolve_stack);
      }
    }
    return Result::kOk;
  };

  // check for dominated column
  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualLower, model->col_lower_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualUpper, model->col_upper_[col], HighsInt{-1}));
  if (colDeleted[col]) return Result::kOk;

  // check for weakly dominated column
  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualLower, model->col_lower_[col],
                         model->col_upper_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualUpper, model->col_upper_[col],
                         model->col_lower_[col], HighsInt{-1}));
  return Result::kOk;
}